

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressPNG.cpp
# Opt level: O0

size_t __thiscall
adios2::core::compress::CompressPNG::Operate
          (CompressPNG *this,char *dataIn,Dims *blockStart,Dims *blockCount,DataType type,
          char *bufferOut)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_t sVar6;
  __jmp_buf_tag *__env;
  value_type puVar7;
  reference ppuVar8;
  uchar **ppuVar9;
  _func_void_png_structp_png_bytep_png_size_t *p_Var10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  long in_RSI;
  Operator *in_RDI;
  char *in_R9;
  DestInfo destInfo;
  size_t r;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rows;
  uint32_t height;
  uint32_t width;
  uint32_t bytesPerPixel;
  png_infop pngInfo;
  png_structp pngWrite;
  const_iterator itColorType;
  string value;
  string key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *itParameter;
  iterator __end2;
  iterator __begin2;
  Params *__range2;
  string colorTypeStr;
  int bitDepth;
  int colorType;
  int compressionLevel;
  size_t ndims;
  anon_class_1_0_00000001 lf_Write;
  size_t paramOffset;
  uint8_t bufferVersion;
  size_t bufferOutOffset;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  undefined4 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  undefined4 in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff90c;
  Operator *in_stack_fffffffffffff910;
  key_type *in_stack_fffffffffffff918;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_fffffffffffff920;
  undefined8 uVar11;
  unsigned_long in_stack_fffffffffffff938;
  undefined8 uVar12;
  undefined8 in_stack_fffffffffffff940;
  int commRank;
  string *in_stack_fffffffffffff948;
  string *in_stack_fffffffffffff950;
  string *in_stack_fffffffffffff958;
  string *source;
  string *in_stack_fffffffffffff960;
  string *component;
  uint local_674;
  allocator *in_stack_fffffffffffff9f8;
  DataType type_00;
  const_iterator in_stack_fffffffffffffa00;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  uchar local_58b [3];
  DestInfo local_588;
  ulong local_578;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> local_568;
  undefined1 local_549 [40];
  undefined1 local_521 [40];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [36];
  uint local_4ac;
  uint local_4a8;
  uint local_4a4;
  undefined8 local_4a0;
  undefined8 local_498;
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [32];
  int32_t local_378;
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  _Self local_2b0;
  _Self local_2a8;
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  reference local_198;
  _Self local_190;
  _Self local_188;
  Params *local_180;
  allocator local_171;
  string local_170 [36];
  int32_t local_14c;
  uint local_148;
  int local_144;
  string local_140 [32];
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [32];
  size_type local_58;
  __0 local_49;
  unsigned_long local_48;
  undefined1 local_39;
  unsigned_long local_38;
  char *local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  long local_10;
  
  local_38 = 0;
  local_39 = 1;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_10 = in_RSI;
  Operator::MakeCommonHeader<unsigned_long>
            (in_stack_fffffffffffff910,
             (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
             (uint8_t)((uint)in_stack_fffffffffffff8fc >> 0x18));
  local_48 = local_38;
  local_38 = local_38 + 0xb;
  local_58 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  if ((local_58 != 3) && (local_58 != 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Operator",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"CompressPNG",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Operate",&local_d9);
    std::__cxx11::to_string(in_stack_fffffffffffff938);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950,
               in_stack_fffffffffffff948,(int)((ulong)in_stack_fffffffffffff940 >> 0x20));
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  local_144 = 1;
  local_148 = 6;
  local_14c = 8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"PNG_COLOR_TYPE_RGBA",&local_171);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  local_180 = &in_RDI->m_Parameters;
  local_188._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  local_190._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  while( true ) {
    bVar1 = std::operator!=(&local_188,&local_190);
    commRank = (int)((ulong)in_stack_fffffffffffff940 >> 0x20);
    type_00 = (DataType)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
    if (!bVar1) break;
    local_198 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0xebb1c4);
    std::__cxx11::string::string(local_1b8,(string *)local_198);
    std::__cxx11::string::string(local_1d8,(string *)&local_198->second);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                            (char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"when setting PNG level parameter\n",&local_1f9);
      local_144 = helper::StringTo<int>
                            ((string *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08)
                             ,(string *)in_stack_fffffffffffffa00._M_node);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      if ((local_144 < 1) || (9 < local_144)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_220,"Operator",&local_221);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_248,"CompressPNG",&local_249);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_270,"Operate",&local_271);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_298,
                   "compression_level must be an integer between 1 (less compression, less memory) and 9 (more compression, more memory) inclusive, in call to ADIOS2 PNG Compress"
                   ,&local_299);
        helper::Throw<std::invalid_argument>
                  (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   in_stack_fffffffffffff948,(int)((ulong)in_stack_fffffffffffff940 >> 0x20));
        std::__cxx11::string::~string(local_298);
        std::allocator<char>::~allocator((allocator<char> *)&local_299);
        std::__cxx11::string::~string(local_270);
        std::allocator<char>::~allocator((allocator<char> *)&local_271);
        std::__cxx11::string::~string(local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
      }
    }
    else {
      in_stack_fffffffffffffa0f =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                           (char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      if ((bool)in_stack_fffffffffffffa0f) {
        in_stack_fffffffffffffa00 =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                    (key_type *)0xebb601);
        local_2a8._M_node = in_stack_fffffffffffffa00._M_node;
        local_2b0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        bVar1 = std::operator==(&local_2a8,&local_2b0);
        if (bVar1) {
          in_stack_fffffffffffff9f8 = &local_2d1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2d0,"Operator",in_stack_fffffffffffff9f8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2f8,"CompressPNG",&local_2f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_320,"Operate",&local_321);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_348,
                     "invalid color_type, see PNG_COLOR_TYPE_* for available types, in call to ADIOS2 PNG Compress"
                     ,&local_349);
          helper::Throw<std::invalid_argument>
                    (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                     in_stack_fffffffffffff948,(int)((ulong)in_stack_fffffffffffff940 >> 0x20));
          std::__cxx11::string::~string(local_348);
          std::allocator<char>::~allocator((allocator<char> *)&local_349);
          std::__cxx11::string::~string(local_320);
          std::allocator<char>::~allocator((allocator<char> *)&local_321);
          std::__cxx11::string::~string(local_2f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
          std::__cxx11::string::~string(local_2d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        }
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                               *)0xebb89f);
        std::__cxx11::string::operator=(local_170,(string *)ppVar3);
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                               *)0xebb8be);
        local_148 = ppVar3->second;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                                (char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8
                                                ));
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_370,"when setting PNG bit_depth parameter\n",&local_371);
          local_14c = helper::StringTo<int>
                                ((string *)
                                 CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
                                 (string *)in_stack_fffffffffffffa00._M_node);
          std::__cxx11::string::~string(local_370);
          std::allocator<char>::~allocator((allocator<char> *)&local_371);
        }
      }
    }
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string(local_1b8);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::at(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  local_378 = local_14c;
  sVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff910,
                     (key_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  if (sVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_398,"Operator",&local_399);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c0,"CompressPNG",&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e8,"Operate",&local_3e9);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff948 >> 0x20));
    std::operator+((char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                   (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950,
               in_stack_fffffffffffff948,commRank);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string(local_450);
    std::__cxx11::string::~string(local_470);
    std::__cxx11::string::~string(local_490);
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
  }
  local_498 = png_create_write_struct("1.6.37",0,0);
  local_4a0 = png_create_info_struct(local_498);
  if (local_58 == 3) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_20,2);
    local_674 = (uint)*pvVar5;
  }
  else {
    sVar6 = helper::GetDataTypeSize(type_00);
    local_674 = (uint)sVar6;
  }
  local_4a4 = local_674;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_20,1);
  local_4a8 = (uint)*pvVar5;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_20,0);
  local_4ac = (uint)*pvVar5;
  png_set_IHDR(local_498,local_4a0,local_4a8,local_4ac,local_14c,local_148,0,0,0);
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_498,longjmp,200);
  iVar2 = _setjmp(__env);
  if (iVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d0,"Operator",&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f8,"CompressPNG",&local_4f9);
    component = (string *)local_521;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_521 + 1),"Operate",(allocator *)component);
    source = (string *)local_549;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_549 + 1),"libpng detected an error in ADIOS2 PNG Compress",
               (allocator *)source);
    helper::Throw<std::invalid_argument>
              (component,source,in_stack_fffffffffffff950,in_stack_fffffffffffff948,commRank);
    std::__cxx11::string::~string((string *)(local_549 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_549);
    std::__cxx11::string::~string((string *)(local_521 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_521);
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    std::__cxx11::string::~string(local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  }
  png_set_compression_level(local_498,local_144);
  std::allocator<unsigned_char_*>::allocator((allocator<unsigned_char_*> *)0xebc185);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
            ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)in_stack_fffffffffffff920,
             (size_type)in_stack_fffffffffffff918,(allocator_type *)in_stack_fffffffffffff910);
  std::allocator<unsigned_char_*>::~allocator((allocator<unsigned_char_*> *)0xebc1ab);
  for (local_578 = 0; uVar11 = local_498, local_578 < local_4ac; local_578 = local_578 + 1) {
    puVar7 = (value_type)(local_10 + local_578 * local_4a8 * (ulong)local_4a4);
    ppuVar8 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                        (&local_568,local_578);
    *ppuVar8 = puVar7;
  }
  uVar12 = local_4a0;
  ppuVar9 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::data
                      ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0xebc27d);
  png_set_rows(uVar11,uVar12,ppuVar9);
  DestInfo::DestInfo(&local_588);
  local_588.BufferOut = local_30;
  local_588.Offset = local_38;
  uVar11 = local_498;
  p_Var10 = Operate(char_const*,std::vector_const&,std::vector_const&,adios2::DataType,char*)::$_0::
            operator_cast_to_function_pointer(&local_49);
  png_set_write_fn(uVar11,&local_588,p_Var10,0);
  png_write_png(local_498,local_4a0,0,0);
  png_write_end(local_498,local_4a0);
  png_destroy_write_struct(&local_498,&local_4a0);
  Operator::PutParameter<unsigned_long,unsigned_long>(in_RDI,local_30,&local_48,&local_588.Offset);
  local_58b[2] = 1;
  Operator::PutParameter<unsigned_char,unsigned_long>(in_RDI,local_30,&local_48,local_58b + 2);
  local_58b[1] = 6;
  Operator::PutParameter<unsigned_char,unsigned_long>(in_RDI,local_30,&local_48,local_58b + 1);
  local_58b[0] = '%';
  Operator::PutParameter<unsigned_char,unsigned_long>(in_RDI,local_30,&local_48,local_58b);
  sVar6 = local_588.Offset;
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
            ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)in_stack_fffffffffffff910)
  ;
  std::__cxx11::string::~string(local_170);
  return sVar6;
}

Assistant:

size_t CompressPNG::Operate(const char *dataIn, const Dims &blockStart, const Dims &blockCount,
                            const DataType type, char *bufferOut)
{
    size_t bufferOutOffset = 0;
    const uint8_t bufferVersion = 1;

    MakeCommonHeader(bufferOut, bufferOutOffset, bufferVersion);

    size_t paramOffset = bufferOutOffset;
    bufferOutOffset += sizeof(size_t) + 3;

    auto lf_Write = [](png_structp png_ptr, png_bytep data, png_size_t length) {
        DestInfo *pDestInfo = reinterpret_cast<DestInfo *>(png_get_io_ptr(png_ptr));
        std::memcpy(pDestInfo->BufferOut + pDestInfo->Offset, data, length);
        pDestInfo->Offset += length;
    };

    const std::size_t ndims = blockCount.size();

    if (ndims != 3 && ndims != 2)
    {
        helper::Throw<std::invalid_argument>(
            "Operator", "CompressPNG", "Operate",
            "image number of dimensions " + std::to_string(ndims) +
                " is invalid, must be 2 {height,width*bytes_per_pixel} or 3"
                " {height,width,bytes_per_pixel]} , in call to ADIOS2 PNG "
                " compression");
    }

    // defaults
    int compressionLevel = 1;
    int colorType = PNG_COLOR_TYPE_RGBA;
    int bitDepth = 8;
    std::string colorTypeStr = "PNG_COLOR_TYPE_RGBA";

    for (const auto &itParameter : m_Parameters)
    {
        const std::string key = itParameter.first;
        const std::string value = itParameter.second;

        if (key == "compression_level")
        {
            compressionLevel = static_cast<int>(
                helper::StringTo<int32_t>(value, "when setting PNG level parameter\n"));

            if (compressionLevel < 1 || compressionLevel > 9)
            {
                helper::Throw<std::invalid_argument>(
                    "Operator", "CompressPNG", "Operate",
                    "compression_level must be an "
                    "integer between 1 (less "
                    "compression, less memory) and 9 "
                    "(more compression, more memory) inclusive, in call to "
                    "ADIOS2 PNG Compress");
            }
        }
        else if (key == "color_type")
        {
            auto itColorType = m_ColorTypes.find(value);

            if (itColorType == m_ColorTypes.end())
            {
                helper::Throw<std::invalid_argument>(
                    "Operator", "CompressPNG", "Operate",
                    "invalid color_type, see PNG_COLOR_TYPE_* for "
                    "available types, in call to ADIOS2 PNG Compress");
            }

            colorTypeStr = itColorType->first;
            colorType = itColorType->second;
        }
        else if (key == "bit_depth")
        {
            bitDepth = static_cast<int>(
                helper::StringTo<int32_t>(value, "when setting PNG bit_depth parameter\n"));
        }
    }

    if (m_BitDepths.at(colorTypeStr).count(static_cast<int32_t>(bitDepth)) == 0)
    {
        helper::Throw<std::invalid_argument>(
            "Operator", "CompressPNG", "Operate",
            "bit_depth " + std::to_string(bitDepth) + " and color_type " + colorTypeStr +
                " combination is not allowed by libpng, in call to ADIOS2 PNG "
                "compression");
    }

    png_structp pngWrite =
        png_create_write_struct(PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);
    png_infop pngInfo = png_create_info_struct(pngWrite);

    const uint32_t bytesPerPixel = ndims == 3
                                       ? static_cast<uint32_t>(blockCount[2])
                                       : static_cast<uint32_t>(helper::GetDataTypeSize(type));

    const uint32_t width = static_cast<uint32_t>(blockCount[1]);
    const uint32_t height = static_cast<uint32_t>(blockCount[0]);

    png_set_IHDR(pngWrite, pngInfo, width, height, bitDepth, colorType, PNG_INTERLACE_NONE,
                 PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

    if (setjmp(png_jmpbuf(pngWrite)))
    {
        helper::Throw<std::invalid_argument>("Operator", "CompressPNG", "Operate",
                                             "libpng detected an error in ADIOS2 PNG Compress");
    }

    png_set_compression_level(pngWrite, compressionLevel);

    // set the rows
    std::vector<uint8_t *> rows(height);
    for (size_t r = 0; r < height; ++r)
    {
        rows[r] =
            reinterpret_cast<uint8_t *>(const_cast<char *>(dataIn)) + r * width * bytesPerPixel;
    }
    png_set_rows(pngWrite, pngInfo, rows.data());

    DestInfo destInfo;
    destInfo.BufferOut = bufferOut;
    destInfo.Offset = bufferOutOffset;

    png_set_write_fn(pngWrite, &destInfo, lf_Write, nullptr);
    png_write_png(pngWrite, pngInfo, PNG_TRANSFORM_IDENTITY, nullptr);
    png_write_end(pngWrite, pngInfo);

    // const size_t compressedSize = png_get_compression_buffer_size(pngWrite);
    png_destroy_write_struct(&pngWrite, &pngInfo);

    PutParameter(bufferOut, paramOffset, destInfo.Offset);
    PutParameter(bufferOut, paramOffset, static_cast<uint8_t>(PNG_LIBPNG_VER_MAJOR));
    PutParameter(bufferOut, paramOffset, static_cast<uint8_t>(PNG_LIBPNG_VER_MINOR));
    PutParameter(bufferOut, paramOffset, static_cast<uint8_t>(PNG_LIBPNG_VER_RELEASE));

    return destInfo.Offset;
}